

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexthtmlparser.cpp
# Opt level: O0

void __thiscall QTextHtmlParser::parseTag(QTextHtmlParser *this)

{
  QStringView element;
  bool bVar1;
  QChar QVar2;
  int iVar3;
  QTextHtmlParserNode **ppQVar4;
  QTextHtmlParserNode *pQVar5;
  qsizetype qVar6;
  QTextHtmlElement *pQVar7;
  QTextHtmlParserNode *this_00;
  QTextHtmlParser *in_RDI;
  long in_FS_OFFSET;
  bool tagClosed;
  int nodeIndex;
  QTextHtmlElement *elem;
  QTextHtmlParserNode *node;
  int p;
  QTextDocument *in_stack_000000a0;
  QList<QCss::Declaration> *in_stack_000000a8;
  QTextHtmlParserNode *in_stack_000000b0;
  StyleSheet sheet;
  Parser parser;
  undefined4 in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  uint6 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe46;
  undefined1 uVar8;
  undefined1 in_stack_fffffffffffffe47;
  undefined1 uVar9;
  QString *in_stack_fffffffffffffe48;
  undefined6 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe56;
  undefined1 uVar10;
  undefined1 in_stack_fffffffffffffe57;
  undefined1 uVar11;
  undefined4 in_stack_fffffffffffffe60;
  uint uVar12;
  undefined4 in_stack_fffffffffffffe64;
  StyleSheet *in_stack_fffffffffffffe68;
  QTextHtmlParser *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  QChar local_174;
  char16_t local_172;
  QChar local_170;
  char16_t local_16e;
  QChar local_16c;
  char16_t local_16a;
  int in_stack_fffffffffffffecc;
  QTextHtmlParser *in_stack_fffffffffffffed0;
  undefined1 local_f0 [16];
  QTextHtmlParser *in_stack_ffffffffffffff20;
  QStringList *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined1 local_50 [68];
  QChar local_c;
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  eatSpace((QTextHtmlParser *)
           CONCAT17(in_stack_fffffffffffffe47,
                    CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)));
  QChar::QChar<char16_t,_true>(&local_a,L'!');
  bVar1 = hasPrefix((QTextHtmlParser *)
                    CONCAT17(in_stack_fffffffffffffe57,
                             CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)),
                    (QChar)(char16_t)((ulong)in_RDI >> 0x30),
                    (int)((ulong)in_stack_fffffffffffffe48 >> 0x20));
  if (bVar1) {
    parseExclamationTag((QTextHtmlParser *)
                        CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    ppQVar4 = QList<QTextHtmlParserNode_*>::last
                        ((QList<QTextHtmlParserNode_*> *)
                         CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    if ((((*ppQVar4)->wsm != WhiteSpacePre) &&
        (ppQVar4 = QList<QTextHtmlParserNode_*>::last
                             ((QList<QTextHtmlParserNode_*> *)
                              CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38)),
        (*ppQVar4)->wsm != WhiteSpacePreWrap)) && ((in_RDI->textEditMode & 1U) == 0)) {
      eatSpace((QTextHtmlParser *)
               CONCAT17(in_stack_fffffffffffffe47,
                        CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)));
    }
  }
  else {
    QChar::QChar<char16_t,_true>(&local_c,L'/');
    bVar1 = hasPrefix((QTextHtmlParser *)
                      CONCAT17(in_stack_fffffffffffffe57,
                               CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)),
                      (QChar)(char16_t)((ulong)in_RDI >> 0x30),
                      (int)((ulong)in_stack_fffffffffffffe48 >> 0x20));
    if (bVar1) {
      ppQVar4 = QList<QTextHtmlParserNode_*>::last
                          ((QList<QTextHtmlParserNode_*> *)
                           CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      if ((*ppQVar4)->id == Html_style) {
        memset(local_50,0xaa,0x40);
        QList<QTextHtmlParserNode_*>::constLast
                  ((QList<QTextHtmlParserNode_*> *)
                   CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        QCss::Parser::Parser
                  ((Parser *)
                   CONCAT17(in_stack_fffffffffffffe57,
                            CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)),
                   in_stack_fffffffffffffe48,(bool)in_stack_fffffffffffffe47);
        memset(local_f0,0xaa,0xa0);
        QCss::StyleSheet::StyleSheet
                  ((StyleSheet *)
                   CONCAT17(in_stack_fffffffffffffe47,
                            CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)));
        QCss::Parser::parse((Parser *)in_stack_fffffffffffffe68,
                            (StyleSheet *)
                            CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                            (CaseSensitivity)((ulong)in_RDI >> 0x20));
        QList<QCss::StyleSheet>::append
                  ((QList<QCss::StyleSheet> *)
                   CONCAT17(in_stack_fffffffffffffe47,
                            CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
                   (parameter_type)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        resolveStyleSheetImports(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        QCss::StyleSheet::~StyleSheet
                  ((StyleSheet *)
                   CONCAT17(in_stack_fffffffffffffe47,
                            CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)));
        QCss::Parser::~Parser
                  ((Parser *)
                   CONCAT17(in_stack_fffffffffffffe47,
                            CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)));
      }
      parseCloseTag(in_RDI);
    }
    else {
      iVar3 = last((QTextHtmlParser *)0x85a3ca);
      while( true ) {
        uVar11 = false;
        if (iVar3 != 0) {
          pQVar5 = at((QTextHtmlParser *)
                      CONCAT17(in_stack_fffffffffffffe47,
                               CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
                      in_stack_fffffffffffffe3c);
          qVar6 = QString::size(&pQVar5->tag);
          uVar11 = qVar6 == 0;
        }
        if ((bool)uVar11 == false) break;
        pQVar5 = at((QTextHtmlParser *)
                    CONCAT17(in_stack_fffffffffffffe47,
                             CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
                    in_stack_fffffffffffffe3c);
        iVar3 = pQVar5->parent;
      }
      pQVar5 = newNode(in_stack_fffffffffffffe70,(int)((ulong)in_stack_fffffffffffffe68 >> 0x20));
      parseWord((QTextHtmlParser *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      QString::toLower((QString *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      QString::operator=((QString *)
                         CONCAT17(in_stack_fffffffffffffe47,
                                  CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
                         (QString *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      QString::~QString((QString *)0x85a476);
      QString::~QString((QString *)0x85a483);
      QStringView::QStringView<QString,_true>
                ((QStringView *)
                 CONCAT17(uVar11,CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50)),
                 in_stack_fffffffffffffe48);
      element.m_data._0_4_ = in_stack_fffffffffffffe78;
      element.m_size = (qsizetype)pQVar5;
      element.m_data._4_4_ = iVar3;
      pQVar7 = lookupElementHelper(element);
      if (pQVar7 == (QTextHtmlElement *)0x0) {
        pQVar5->id = Html_unknown;
      }
      else {
        pQVar5->id = pQVar7->id;
        *(ushort *)&pQVar5->field_0x90 =
             *(ushort *)&pQVar5->field_0x90 & 0xf1ff | ((ushort)pQVar7->displayMode & 7) << 9;
      }
      QList<QString>::clear
                ((QList<QString> *)
                 CONCAT17(in_stack_fffffffffffffe47,
                          CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)));
      uVar10 = false;
      if (in_RDI->pos < in_RDI->len) {
        QVar2 = QString::at(in_stack_fffffffffffffe48,
                            CONCAT17(in_stack_fffffffffffffe47,
                                     CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)))
        ;
        in_stack_fffffffffffffecc = CONCAT22(QVar2.ucs,(short)in_stack_fffffffffffffecc);
        uVar10 = QChar::isSpace((QChar *)0x85a54e);
      }
      if ((bool)uVar10 != false) {
        parseAttributes((QTextHtmlParser *)pQVar5);
        QList<QString>::operator=
                  ((QList<QString> *)
                   CONCAT17(in_stack_fffffffffffffe47,
                            CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
                   (QList<QString> *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        QList<QString>::~QList((QList<QString> *)0x85a588);
      }
      this_00 = resolveParent(in_stack_ffffffffffffff20);
      resolveNode((QTextHtmlParser *)CONCAT17(uVar11,CONCAT16(uVar10,in_stack_fffffffffffffe50)));
      QList<QTextHtmlParserNode_*>::size(&in_RDI->nodes);
      pQVar5 = this_00;
      declarationsForNode(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
      QTextHtmlParserNode::applyCssDeclarations
                (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
      QList<QCss::Declaration>::~QList((QList<QCss::Declaration> *)0x85a5f2);
      applyAttributes((QTextHtmlParser *)
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      in_stack_ffffffffffffff80);
      uVar12 = 0;
      while( true ) {
        uVar9 = false;
        if (in_RDI->pos < in_RDI->len) {
          local_16a = (char16_t)
                      QString::at(&this_00->tag,
                                  (ulong)CONCAT16(in_stack_fffffffffffffe46,
                                                  in_stack_fffffffffffffe40));
          QChar::QChar<char16_t,_true>(&local_16c,L'>');
          uVar9 = ::operator!=((QChar *)CONCAT17(uVar9,CONCAT16(in_stack_fffffffffffffe46,
                                                                in_stack_fffffffffffffe40)),
                               (QChar *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38
                                                ));
        }
        iVar3 = (int)((ulong)pQVar7 >> 0x20);
        if ((bool)uVar9 == false) break;
        local_16e = (char16_t)
                    QString::at(&this_00->tag,
                                CONCAT17(uVar9,CONCAT16(in_stack_fffffffffffffe46,
                                                        in_stack_fffffffffffffe40)));
        QChar::QChar<char16_t,_true>(&local_170,L'/');
        bVar1 = ::operator==((QChar *)CONCAT17(uVar9,CONCAT16(in_stack_fffffffffffffe46,
                                                              in_stack_fffffffffffffe40)),
                             (QChar *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38))
        ;
        if (bVar1) {
          uVar12 = 0x1000000;
        }
        in_RDI->pos = in_RDI->pos + 1;
      }
      in_RDI->pos = in_RDI->pos + 1;
      if ((((pQVar5->wsm == WhiteSpacePre) || (pQVar5->wsm == WhiteSpacePreWrap)) ||
          (pQVar5->wsm == WhiteSpacePreLine)) &&
         (bVar1 = QTextHtmlParserNode::isBlock(pQVar5), bVar1)) {
        uVar8 = false;
        if (in_RDI->pos < in_RDI->len + -1) {
          local_172 = (char16_t)
                      QString::at(&this_00->tag,CONCAT17(uVar9,(uint7)in_stack_fffffffffffffe40));
          QChar::QChar<char16_t,_true>(&local_174,L'\n');
          uVar8 = ::operator==((QChar *)CONCAT17(uVar9,CONCAT16(uVar8,in_stack_fffffffffffffe40)),
                               (QChar *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38
                                                ));
        }
        if ((bool)uVar8 != false) {
          in_RDI->pos = in_RDI->pos + 1;
        }
      }
      bVar1 = QTextHtmlParserNode::mayNotHaveChildren(pQVar5);
      if ((bVar1) || ((uVar12 & 0x1000000) != 0)) {
        newNode((QTextHtmlParser *)pQVar5,iVar3);
        resolveNode((QTextHtmlParser *)CONCAT17(uVar11,CONCAT16(uVar10,in_stack_fffffffffffffe50)));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextHtmlParser::parseTag()
{
    eatSpace();

    // handle comments and other exclamation mark declarations
    if (hasPrefix(u'!')) {
        parseExclamationTag();
        if (nodes.last()->wsm != QTextHtmlParserNode::WhiteSpacePre
            && nodes.last()->wsm != QTextHtmlParserNode::WhiteSpacePreWrap
                && !textEditMode)
            eatSpace();
        return;
    }

    // if close tag just close
    if (hasPrefix(u'/')) {
        if (nodes.last()->id == Html_style) {
#ifndef QT_NO_CSSPARSER
            QCss::Parser parser(nodes.constLast()->text);
            QCss::StyleSheet sheet;
            sheet.origin = QCss::StyleSheetOrigin_Author;
            parser.parse(&sheet, Qt::CaseInsensitive);
            inlineStyleSheets.append(sheet);
            resolveStyleSheetImports(sheet);
#endif
        }
        parseCloseTag();
        return;
    }

    int p = last();
    while (p && at(p).tag.size() == 0)
        p = at(p).parent;

    QTextHtmlParserNode *node = newNode(p);

    // parse tag name
    node->tag = parseWord().toLower();

    const QTextHtmlElement *elem = lookupElementHelper(node->tag);
    if (elem) {
        node->id = elem->id;
        node->displayMode = elem->displayMode;
    } else {
        node->id = Html_unknown;
    }

    node->attributes.clear();
    // _need_ at least one space after the tag name, otherwise there can't be attributes
    if (pos < len && txt.at(pos).isSpace())
        node->attributes = parseAttributes();

    // resolveParent() may have to change the order in the tree and
    // insert intermediate nodes for buggy HTML, so re-initialize the 'node'
    // pointer through the return value
    node = resolveParent();
    resolveNode();

#ifndef QT_NO_CSSPARSER
    const int nodeIndex = nodes.size() - 1; // this new node is always the last
    node->applyCssDeclarations(declarationsForNode(nodeIndex), resourceProvider);
#endif
    applyAttributes(node->attributes);

    // finish tag
    bool tagClosed = false;
    while (pos < len && txt.at(pos) != u'>') {
        if (txt.at(pos) == u'/')
            tagClosed = true;

        pos++;
    }
    pos++;

    // in a white-space preserving environment strip off a initial newline
    // since the element itself already generates a newline
    if ((node->wsm == QTextHtmlParserNode::WhiteSpacePre
         || node->wsm == QTextHtmlParserNode::WhiteSpacePreWrap
         || node->wsm == QTextHtmlParserNode::WhiteSpacePreLine)
        && node->isBlock()) {
        if (pos < len - 1 && txt.at(pos) == u'\n')
            ++pos;
    }

    if (node->mayNotHaveChildren() || tagClosed) {
        newNode(node->parent);
        resolveNode();
    }
}